

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O2

void __thiscall
glslang::TConstUnionArray::TConstUnionArray(TConstUnionArray *this,int size,TConstUnion *val)

{
  TVector<glslang::TConstUnion> *this_00;
  undefined4 in_register_00000034;
  
  this->_vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_0089abb8;
  this_00 = (TVector<glslang::TConstUnion> *)
            TVector<glslang::TConstUnion>::operator_new
                      ((TVector<glslang::TConstUnion> *)0x20,CONCAT44(in_register_00000034,size));
  TVector<glslang::TConstUnion>::TVector(this_00,(long)size,val);
  this->unionArray = this_00;
  return;
}

Assistant:

TConstUnionArray(int size, const TConstUnion& val)
    {
        unionArray = new TConstUnionVector(size, val);
    }